

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::XMLAbstractDoubleFloat::init(XMLAbstractDoubleFloat *this,EVP_PKEY_CTX *ctx)

{
  ushort uVar1;
  bool bVar2;
  int extraout_EAX;
  NumberFormatException *pNVar3;
  XMLCh *pXVar4;
  MemoryManager *pMVar5;
  MemoryManager *pMVar6;
  XMLSize_t XVar7;
  undefined1 local_d0 [8];
  ArrayJanitor<char> janStr;
  char *nptr;
  char buffer [101];
  ulong uStack_48;
  XMLCh curChar;
  XMLSize_t lenTempStrValue;
  ArrayJanitor<char16_t> janTmpName;
  XMLCh *tmpStrValue;
  XMLCh *strValue_local;
  XMLAbstractDoubleFloat *this_local;
  
  if ((ctx == (EVP_PKEY_CTX *)0x0) || (*(short *)ctx == 0)) {
    pNVar3 = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (pNVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
               ,0x45,XMLNUM_emptyString,this->fMemoryManager);
    __cxa_throw(pNVar3,&NumberFormatException::typeinfo,
                NumberFormatException::~NumberFormatException);
  }
  pXVar4 = XMLString::replicate((XMLCh *)ctx,this->fMemoryManager);
  this->fRawData = pXVar4;
  janTmpName.fMemoryManager =
       (MemoryManager *)XMLString::replicate((XMLCh *)ctx,this->fMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)&lenTempStrValue,(char16_t *)janTmpName.fMemoryManager,
             this->fMemoryManager);
  XMLString::trim((XMLCh *)janTmpName.fMemoryManager);
  if (*(short *)&(janTmpName.fMemoryManager)->_vptr_MemoryManager == 0) {
    pNVar3 = (NumberFormatException *)__cxa_allocate_exception(0x30);
    NumberFormatException::NumberFormatException
              (pNVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
               ,0x4e,XMLNUM_emptyString,this->fMemoryManager);
    __cxa_throw(pNVar3,&NumberFormatException::typeinfo,
                NumberFormatException::~NumberFormatException);
  }
  normalizeZero(this,(XMLCh *)janTmpName.fMemoryManager);
  bVar2 = XMLString::equals((XMLCh *)janTmpName.fMemoryManager,(XMLCh *)XMLUni::fgNegINFString);
  if (bVar2) {
    this->fType = NegINF;
    this->fSign = -1;
  }
  else {
    bVar2 = XMLString::equals((XMLCh *)janTmpName.fMemoryManager,L"INF");
    if (bVar2) {
      this->fType = PosINF;
      this->fSign = 1;
    }
    else {
      bVar2 = XMLString::equals((XMLCh *)janTmpName.fMemoryManager,L"NaN");
      pMVar5 = janTmpName.fMemoryManager;
      if (bVar2) {
        this->fType = NaN;
        this->fSign = 1;
      }
      else {
        for (uStack_48 = 0;
            uVar1 = *(ushort *)
                     ((long)&(janTmpName.fMemoryManager)->_vptr_MemoryManager + uStack_48 * 2),
            uVar1 != 0; uStack_48 = uStack_48 + 1) {
          if ((((uVar1 < 0x30) || (0x39 < uVar1)) && (uVar1 != 0x2e)) &&
             (((uVar1 != 0x2d && (uVar1 != 0x2b)) && ((uVar1 != 0x45 && (uVar1 != 0x65)))))) {
            pNVar3 = (NumberFormatException *)__cxa_allocate_exception(0x30);
            pMVar5 = getMemoryManager(this);
            NumberFormatException::NumberFormatException
                      (pNVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
                       ,0x7f,XMLNUM_Inv_chars,pMVar5);
            __cxa_throw(pNVar3,&NumberFormatException::typeinfo,
                        NumberFormatException::~NumberFormatException);
          }
        }
        if (uStack_48 < 100) {
          pMVar6 = getMemoryManager(this);
          XMLString::transcode((XMLCh *)pMVar5,(char *)&nptr,100,pMVar6);
          buffer[0x5c] = '\0';
          XVar7 = XMLString::stringLen((char *)&nptr);
          if (XVar7 != uStack_48) {
            pNVar3 = (NumberFormatException *)__cxa_allocate_exception(0x30);
            pMVar5 = getMemoryManager(this);
            NumberFormatException::NumberFormatException
                      (pNVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLAbstractDoubleFloat.cpp"
                       ,0x9f,XMLNUM_Inv_chars,pMVar5);
            __cxa_throw(pNVar3,&NumberFormatException::typeinfo,
                        NumberFormatException::~NumberFormatException);
          }
          (*(this->super_XMLNumber).super_XSerializable._vptr_XSerializable[8])(this,&nptr);
        }
        else {
          pMVar6 = getMemoryManager(this);
          janStr.fMemoryManager = (MemoryManager *)XMLString::transcode((XMLCh *)pMVar5,pMVar6);
          ArrayJanitor<char>::ArrayJanitor
                    ((ArrayJanitor<char> *)local_d0,(char *)janStr.fMemoryManager,
                     this->fMemoryManager);
          (*(this->super_XMLNumber).super_XSerializable._vptr_XSerializable[8])
                    (this,janStr.fMemoryManager);
          ArrayJanitor<char>::~ArrayJanitor((ArrayJanitor<char> *)local_d0);
        }
      }
    }
  }
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&lenTempStrValue);
  return extraout_EAX;
}

Assistant:

void XMLAbstractDoubleFloat::init(const XMLCh* const strValue)
{
    if ((!strValue) || (!*strValue))
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, fMemoryManager);

    fRawData = XMLString::replicate(strValue, fMemoryManager);   // preserve the raw data form

    XMLCh* tmpStrValue = XMLString::replicate(strValue, fMemoryManager);
    ArrayJanitor<XMLCh> janTmpName(tmpStrValue, fMemoryManager);
    XMLString::trim(tmpStrValue);

    if (!*tmpStrValue) 
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, fMemoryManager);

    normalizeZero(tmpStrValue);

    if (XMLString::equals(tmpStrValue, XMLUni::fgNegINFString) )
    {
        fType = NegINF;
        fSign = -1;
    }
    else if (XMLString::equals(tmpStrValue, XMLUni::fgPosINFString) )
    {
        fType = PosINF;
        fSign = 1;
    }
    else if (XMLString::equals(tmpStrValue, XMLUni::fgNaNString) )
    {
        fType = NaN;
        fSign = 1;
    }
    else
        //
        // Normal case
        //
    {
        // Use a stack-based buffer when possible.  Since all
        // valid doubles or floats will only contain ASCII
        // digits, a decimal point,  or the exponent character,
        // they will all be single byte characters, and this will
        // work.
        static const XMLSize_t maxStackSize = 100;

        XMLSize_t lenTempStrValue = 0;

        
        // Need to check that the string only contains valid schema characters
        // since the call to strtod may allow other values.  For example, AIX
        // allows "infinity" and "+INF"
        XMLCh curChar;
        while ((curChar = tmpStrValue[lenTempStrValue])!=0) {
            if (!((curChar >= chDigit_0 &&
                   curChar <= chDigit_9) ||
                  curChar == chPeriod  ||
                  curChar == chDash    ||
                  curChar == chPlus    ||
                  curChar == chLatin_E ||
                  curChar == chLatin_e)) {                
                ThrowXMLwithMemMgr(
                    NumberFormatException,
                    XMLExcepts::XMLNUM_Inv_chars,
                    getMemoryManager());
            }            
            lenTempStrValue++;
        }
       
        if (lenTempStrValue < maxStackSize)
        {
            char    buffer[maxStackSize + 1];

            XMLString::transcode(
                tmpStrValue,
                buffer,
                sizeof(buffer) - 1,
                getMemoryManager());

            // Do this for safety, because we've
            // no guarantee we didn't overrun the
            // capacity of the buffer when transcoding
            // a bogus value.
            buffer[maxStackSize] = '\0';

            // If they aren't the same length, then some
            // non-ASCII multibyte character was present.
            // This will only happen in the case where the
            // string has a bogus character, and it's long
            // enough to overrun this buffer, but we need
            // to check, even if it's unlikely to happen.
            if (XMLString::stringLen(buffer) != lenTempStrValue)
            {
                ThrowXMLwithMemMgr(
                    NumberFormatException,
                    XMLExcepts::XMLNUM_Inv_chars,
                    getMemoryManager());
            }

            checkBoundary(buffer);
        }
        else
        {
            char *nptr = XMLString::transcode(tmpStrValue, getMemoryManager());
            const ArrayJanitor<char> janStr(nptr, fMemoryManager);

            checkBoundary(nptr);
        }
    }

}